

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O0

void save_components_to_files
               (TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int format,
               char *filepath1,char *filepath2,char *filepath3)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER bmInfo_01;
  BITMAPINFOHEADER bmInfo_02;
  BITMAPINFOHEADER bmInfo_03;
  BITMAPINFOHEADER bmInfo_04;
  BITMAPINFOHEADER bmInfo_05;
  BITMAPFILEHEADER bmFile_00;
  BITMAPFILEHEADER bmFile_01;
  BITMAPFILEHEADER bmFile_02;
  BITMAPFILEHEADER bmFile_03;
  BITMAPFILEHEADER bmFile_04;
  BITMAPFILEHEADER bmFile_05;
  ulong uVar8;
  TRIPLERGB *pTVar9;
  void *pvVar10;
  int local_1bc;
  undefined4 uStack_1b8;
  int i_1;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  TRIPLERGB **local_190;
  BITMAPFILEHEADER local_188;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  TRIPLERGB **local_158;
  BITMAPFILEHEADER local_150;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  TRIPLERGB **local_120;
  BITMAPFILEHEADER local_118;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  TRIPLERGB **local_e8;
  BITMAPFILEHEADER local_e0;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  TRIPLERGB **local_b0;
  BITMAPFILEHEADER local_a8;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  TRIPLERGB **local_78;
  BITMAPFILEHEADER local_70;
  size_t j;
  size_t i;
  TRIPLERGB **mrxC;
  TRIPLERGB **mrxB;
  TRIPLERGB **mrxA;
  int width;
  int height;
  char *filepath2_local;
  char *filepath1_local;
  TRIPLERGB **ppTStack_20;
  int format_local;
  TRIPLERGB **mrx_local;
  BITMAPFILEHEADER bmFile_local;
  
  bmFile_local._0_8_ = bmFile._8_8_;
  mrx_local = bmFile._0_8_;
  mrxA._4_4_ = bmInfo.biHeight;
  mrxA._0_4_ = bmInfo.biWidth;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)bmInfo.biHeight;
  uVar8 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  _width = filepath2;
  filepath2_local = filepath1;
  filepath1_local._4_4_ = format;
  ppTStack_20 = mrx;
  mrxB = (TRIPLERGB **)operator_new__(uVar8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)mrxA._4_4_;
  uVar8 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  mrxC = (TRIPLERGB **)operator_new__(uVar8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(int)mrxA._4_4_;
  uVar8 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  i = (size_t)operator_new__(uVar8);
  for (j = 0; j < (ulong)(long)(int)mrxA._4_4_; j = j + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(int)(uint)mrxA;
    uVar8 = SUB168(auVar5 * ZEXT816(3),0);
    if (SUB168(auVar5 * ZEXT816(3),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pTVar9 = (TRIPLERGB *)operator_new__(uVar8);
    mrxB[j] = pTVar9;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(int)(uint)mrxA;
    uVar8 = SUB168(auVar6 * ZEXT816(3),0);
    if (SUB168(auVar6 * ZEXT816(3),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pTVar9 = (TRIPLERGB *)operator_new__(uVar8);
    mrxC[j] = pTVar9;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)(int)(uint)mrxA;
    uVar8 = SUB168(auVar7 * ZEXT816(3),0);
    if (SUB168(auVar7 * ZEXT816(3),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar8);
    *(void **)(i + j * 8) = pvVar10;
    local_70.bfReserved1 = 0;
    local_70.bfReserved2 = 0;
    local_70.bfOffBits = 0;
    for (; (ulong)local_70._8_8_ < (ulong)(long)(int)(uint)mrxA; local_70._8_8_ = local_70._8_8_ + 1
        ) {
      if (filepath1_local._4_4_ == 0) {
        mrxB[j][local_70._8_8_].red = ppTStack_20[j][local_70._8_8_].red;
        mrxC[j][local_70._8_8_].green = ppTStack_20[j][local_70._8_8_].green;
        *(uchar *)(*(long *)(i + j * 8) + local_70._8_8_ * 3) = ppTStack_20[j][local_70._8_8_].blue;
      }
      else if (filepath1_local._4_4_ == 1) {
        uVar1 = ppTStack_20[j][local_70._8_8_].red;
        mrxB[j][local_70._8_8_].blue = uVar1;
        mrxB[j][local_70._8_8_].green = uVar1;
        mrxB[j][local_70._8_8_].red = uVar1;
        uVar1 = ppTStack_20[j][local_70._8_8_].green;
        mrxC[j][local_70._8_8_].blue = uVar1;
        mrxC[j][local_70._8_8_].green = uVar1;
        mrxC[j][local_70._8_8_].red = uVar1;
        uVar1 = ppTStack_20[j][local_70._8_8_].blue;
        *(uchar *)(*(long *)(i + j * 8) + local_70._8_8_ * 3) = uVar1;
        *(uchar *)(*(long *)(i + j * 8) + local_70._8_8_ * 3 + 1) = uVar1;
        *(uchar *)(*(long *)(i + j * 8) + local_70._8_8_ * 3 + 2) = uVar1;
      }
    }
  }
  if (filepath1_local._4_4_ == 0) {
    local_78 = mrx_local;
    local_70.bfType = bmFile_local.bfType;
    local_70._2_2_ = bmFile_local._2_2_;
    local_70.bfSize = bmFile_local.bfSize;
    memcpy(&local_a8.bfReserved1,&bmInfo,0x28);
    bmFile_05.bfReserved1 = local_70.bfType;
    bmFile_05.bfReserved2 = local_70._2_2_;
    bmFile_05.bfOffBits = local_70.bfSize;
    bmFile_05._0_8_ = local_78;
    bmInfo_00.biHeight = (undefined4)uStack_98;
    bmInfo_00.biPlanes = uStack_98._4_2_;
    bmInfo_00.biBitCount = uStack_98._6_2_;
    bmInfo_00._0_8_ = local_a8._8_8_;
    bmInfo_00.biCompression = (undefined4)local_90;
    bmInfo_00.biSizeImage = local_90._4_4_;
    bmInfo_00.biXPelsPerMeter = (undefined4)uStack_88;
    bmInfo_00.biYPelsPerMeter = uStack_88._4_4_;
    bmInfo_00.biClrUsed = (undefined4)local_80;
    bmInfo_00.biClrImportant = local_80._4_4_;
    saveBMPFile(bmFile_05,bmInfo_00,mrxB,filepath2_local);
    local_b0 = mrx_local;
    local_a8.bfType = bmFile_local.bfType;
    local_a8._2_2_ = bmFile_local._2_2_;
    local_a8.bfSize = bmFile_local.bfSize;
    memcpy(&local_e0.bfReserved1,&bmInfo,0x28);
    bmFile_04.bfReserved1 = local_a8.bfType;
    bmFile_04.bfReserved2 = local_a8._2_2_;
    bmFile_04.bfOffBits = local_a8.bfSize;
    bmFile_04._0_8_ = local_b0;
    bmInfo_01.biHeight = (undefined4)uStack_d0;
    bmInfo_01.biPlanes = uStack_d0._4_2_;
    bmInfo_01.biBitCount = uStack_d0._6_2_;
    bmInfo_01._0_8_ = local_e0._8_8_;
    bmInfo_01.biCompression = (undefined4)local_c8;
    bmInfo_01.biSizeImage = local_c8._4_4_;
    bmInfo_01.biXPelsPerMeter = (undefined4)uStack_c0;
    bmInfo_01.biYPelsPerMeter = uStack_c0._4_4_;
    bmInfo_01.biClrUsed = (undefined4)local_b8;
    bmInfo_01.biClrImportant = local_b8._4_4_;
    saveBMPFile(bmFile_04,bmInfo_01,mrxC,_width);
    local_e8 = mrx_local;
    local_e0.bfType = bmFile_local.bfType;
    local_e0._2_2_ = bmFile_local._2_2_;
    local_e0.bfSize = bmFile_local.bfSize;
    memcpy(&local_118.bfReserved1,&bmInfo,0x28);
    bmFile_03.bfReserved1 = local_e0.bfType;
    bmFile_03.bfReserved2 = local_e0._2_2_;
    bmFile_03.bfOffBits = local_e0.bfSize;
    bmFile_03._0_8_ = local_e8;
    bmInfo_02.biHeight = (undefined4)uStack_108;
    bmInfo_02.biPlanes = uStack_108._4_2_;
    bmInfo_02.biBitCount = uStack_108._6_2_;
    bmInfo_02._0_8_ = local_118._8_8_;
    bmInfo_02.biCompression = (undefined4)local_100;
    bmInfo_02.biSizeImage = local_100._4_4_;
    bmInfo_02.biXPelsPerMeter = (undefined4)uStack_f8;
    bmInfo_02.biYPelsPerMeter = uStack_f8._4_4_;
    bmInfo_02.biClrUsed = (undefined4)local_f0;
    bmInfo_02.biClrImportant = local_f0._4_4_;
    saveBMPFile(bmFile_03,bmInfo_02,(TRIPLERGB **)i,filepath3);
  }
  else if (filepath1_local._4_4_ == 1) {
    local_120 = mrx_local;
    local_118.bfType = bmFile_local.bfType;
    local_118._2_2_ = bmFile_local._2_2_;
    local_118.bfSize = bmFile_local.bfSize;
    memcpy(&local_150.bfReserved1,&bmInfo,0x28);
    bmFile_02.bfReserved1 = local_118.bfType;
    bmFile_02.bfReserved2 = local_118._2_2_;
    bmFile_02.bfOffBits = local_118.bfSize;
    bmFile_02._0_8_ = local_120;
    bmInfo_03.biHeight = (undefined4)uStack_140;
    bmInfo_03.biPlanes = uStack_140._4_2_;
    bmInfo_03.biBitCount = uStack_140._6_2_;
    bmInfo_03._0_8_ = local_150._8_8_;
    bmInfo_03.biCompression = (undefined4)local_138;
    bmInfo_03.biSizeImage = local_138._4_4_;
    bmInfo_03.biXPelsPerMeter = (undefined4)uStack_130;
    bmInfo_03.biYPelsPerMeter = uStack_130._4_4_;
    bmInfo_03.biClrUsed = (undefined4)local_128;
    bmInfo_03.biClrImportant = local_128._4_4_;
    saveBMPFile(bmFile_02,bmInfo_03,mrxB,filepath2_local);
    local_158 = mrx_local;
    local_150.bfType = bmFile_local.bfType;
    local_150._2_2_ = bmFile_local._2_2_;
    local_150.bfSize = bmFile_local.bfSize;
    memcpy(&local_188.bfReserved1,&bmInfo,0x28);
    bmFile_01.bfReserved1 = local_150.bfType;
    bmFile_01.bfReserved2 = local_150._2_2_;
    bmFile_01.bfOffBits = local_150.bfSize;
    bmFile_01._0_8_ = local_158;
    bmInfo_04.biHeight = (undefined4)uStack_178;
    bmInfo_04.biPlanes = uStack_178._4_2_;
    bmInfo_04.biBitCount = uStack_178._6_2_;
    bmInfo_04._0_8_ = local_188._8_8_;
    bmInfo_04.biCompression = (undefined4)local_170;
    bmInfo_04.biSizeImage = local_170._4_4_;
    bmInfo_04.biXPelsPerMeter = (undefined4)uStack_168;
    bmInfo_04.biYPelsPerMeter = uStack_168._4_4_;
    bmInfo_04.biClrUsed = (undefined4)local_160;
    bmInfo_04.biClrImportant = local_160._4_4_;
    saveBMPFile(bmFile_01,bmInfo_04,mrxC,_width);
    local_190 = mrx_local;
    local_188.bfType = bmFile_local.bfType;
    local_188._2_2_ = bmFile_local._2_2_;
    local_188.bfSize = bmFile_local.bfSize;
    memcpy(&stack0xfffffffffffffe48,&bmInfo,0x28);
    bmFile_00.bfReserved1 = local_188.bfType;
    bmFile_00.bfReserved2 = local_188._2_2_;
    bmFile_00.bfOffBits = local_188.bfSize;
    bmFile_00._0_8_ = local_190;
    bmInfo_05.biHeight = (undefined4)uStack_1b0;
    bmInfo_05.biPlanes = uStack_1b0._4_2_;
    bmInfo_05.biBitCount = uStack_1b0._6_2_;
    bmInfo_05.biSize = uStack_1b8;
    bmInfo_05.biWidth = i_1;
    bmInfo_05.biCompression = (undefined4)local_1a8;
    bmInfo_05.biSizeImage = local_1a8._4_4_;
    bmInfo_05.biXPelsPerMeter = (undefined4)uStack_1a0;
    bmInfo_05.biYPelsPerMeter = uStack_1a0._4_4_;
    bmInfo_05.biClrUsed = (undefined4)local_198;
    bmInfo_05.biClrImportant = local_198._4_4_;
    saveBMPFile(bmFile_00,bmInfo_05,(TRIPLERGB **)i,filepath3);
  }
  for (local_1bc = 0; local_1bc < (int)mrxA._4_4_; local_1bc = local_1bc + 1) {
    if (mrxB[local_1bc] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxB[local_1bc]);
    }
    if (mrxC[local_1bc] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxC[local_1bc]);
    }
    pvVar10 = *(void **)(i + (long)local_1bc * 8);
    if (pvVar10 != (void *)0x0) {
      operator_delete__(pvVar10);
    }
  }
  if (mrxB != (TRIPLERGB **)0x0) {
    operator_delete__(mrxB);
  }
  if (mrxC != (TRIPLERGB **)0x0) {
    operator_delete__(mrxC);
  }
  if (i != 0) {
    operator_delete__((void *)i);
  }
  return;
}

Assistant:

void save_components_to_files(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo, int format,
                              const char *filepath1, const char *filepath2, const char *filepath3) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    TRIPLERGB **mrxA = new TRIPLERGB *[height];
    TRIPLERGB **mrxB = new TRIPLERGB *[height];
    TRIPLERGB **mrxC = new TRIPLERGB *[height];
    for (size_t i = 0; i < height; i++) {
        mrxA[i] = new TRIPLERGB[width];
        mrxB[i] = new TRIPLERGB[width];
        mrxC[i] = new TRIPLERGB[width];
        for (size_t j = 0; j < width; j++) {
            switch (format) {
                case FORMAT_RGB:
                    mrxA[i][j].red = mrx[i][j].red;
                    mrxB[i][j].green = mrx[i][j].green;
                    mrxC[i][j].blue = mrx[i][j].blue;
                    break;
                case FORMAT_YCBCR:
                    mrxA[i][j].red = mrxA[i][j].green = mrxA[i][j].blue = mrx[i][j].red;
                    mrxB[i][j].red = mrxB[i][j].green = mrxB[i][j].blue = mrx[i][j].green;
                    mrxC[i][j].red = mrxC[i][j].green = mrxC[i][j].blue = mrx[i][j].blue;
                    break;
                default:
                    break;
            }
        }
    }
    switch (format) {
        case FORMAT_RGB:
            saveBMPFile(bmFile, bmInfo, mrxA, filepath1);
            saveBMPFile(bmFile, bmInfo, mrxB, filepath2);
            saveBMPFile(bmFile, bmInfo, mrxC, filepath3);
            break;
        case FORMAT_YCBCR:
            saveBMPFile(bmFile, bmInfo, mrxA, filepath1);
            saveBMPFile(bmFile, bmInfo, mrxB, filepath2);
            saveBMPFile(bmFile, bmInfo, mrxC, filepath3);
            break;
        default:
            break;
    }
    for (int i = 0; i < height; i++) {
        delete[] mrxA[i];
        delete[] mrxB[i];
        delete[] mrxC[i];
    }
    delete[] mrxA;
    delete[] mrxB;
    delete[] mrxC;
}